

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

bool __thiscall Spi::sync_mpsse(Spi *this)

{
  int iVar1;
  long lVar2;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  BYTE byInputBuffer [8];
  DWORD dwNumBytesSent;
  BYTE byOutputBuffer [8];
  int local_28;
  char local_24 [8];
  undefined4 local_1c;
  undefined1 local_18 [8];
  
  local_1c = 0;
  local_28 = 0;
  local_18[0] = 0xaa;
  FT_Write(this->ftHandle,local_18,1);
  do {
    iVar1 = FT_GetQueueStatus(this->ftHandle,&local_28);
  } while (iVar1 == 0 && local_28 == 0);
  FT_Read(this->ftHandle,local_24);
  lVar2 = 0;
  while ((local_24[lVar2] != -6 || (local_24[lVar2 + 1] != -0x56))) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0xffffffff) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Spi::sync_mpsse() {
	BYTE byOutputBuffer[8]; // Buffer to hold MPSSE commands and data to be sent to the FT2232H
	BYTE byInputBuffer[8]; // Buffer to hold data read from the FT2232H
	DWORD dwCount = 0; // General loop index
	DWORD dwNumBytesToSend = 0; // Index to the output buffer
	DWORD dwNumBytesSent = 0; // Count of actual bytes sent - used with FT_Write
	DWORD dwNumBytesToRead = 0; // Number of bytes available to read in the driver's input buffer
	DWORD dwNumBytesRead = 0; // Count of actual bytes read - used with FT_Read
	FT_STATUS ftStatus;

	byOutputBuffer[dwNumBytesToSend++] = 0xAA;	//'\xAA';
	//Add bogus command ‘xAA’ to the queue
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the BAD commands
	dwNumBytesToSend = 0; // Reset output buffer pointer
	do {
		ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
		// Get the number of bytes in the device input buffer
	} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
	if (dwNumBytesRead > 8) {
		cerr << "Input buffer too small in sync_mpsse()!" << endl;
		return false;
	}
	//or Timeout
	bool bCommandEchod = false;
	ftStatus = FT_Read(ftHandle, &byInputBuffer, dwNumBytesToRead,
			&dwNumBytesRead);
	//Read out the data from input buffer
	for (dwCount = 0; dwCount < dwNumBytesRead - 1; dwCount++)
	//Check if Bad command and echo command received
			{
		if ((byInputBuffer[dwCount] == 0xFA)
				&& (byInputBuffer[dwCount + 1] == 0xAA)) {
			bCommandEchod = true;
			break;
		}
	}

	return bCommandEchod;
}